

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

void __thiscall StringType::~StringType(StringType *this)

{
  void *in_RDI;
  StringType *unaff_retaddr;
  
  ~StringType(unaff_retaddr);
  operator_delete(in_RDI,0x1b0);
  return;
}

Assistant:

StringType::~StringType()
	{
	// TODO: Unref for Objects
	// Question: why Unref?
	//
	// Unref(str_);
	// Unref(regex_);

	delete string_length_var_field_;
	delete elem_datatype_;
	}